

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O0

int __thiscall cmCTestMultiProcessHandler::FindMaxIndex(cmCTestMultiProcessHandler *this)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_28;
  _Self local_20;
  iterator i;
  int max;
  cmCTestMultiProcessHandler *this_local;
  
  i._M_node._4_4_ = 0;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
       ::begin(&(this->Tests).
                super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
              );
  while( true ) {
    local_28._M_node =
         (_Base_ptr)
         std::
         map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
         ::end(&(this->Tests).
                super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
              );
    bVar1 = std::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>::
             operator->(&local_20);
    if (i._M_node._4_4_ < ppVar2->first) {
      ppVar2 = std::_Rb_tree_iterator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>::
               operator->(&local_20);
      i._M_node._4_4_ = ppVar2->first;
    }
    std::_Rb_tree_iterator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>::operator++
              (&local_20);
  }
  return i._M_node._4_4_;
}

Assistant:

int cmCTestMultiProcessHandler::FindMaxIndex()
{
  int max = 0;
  cmCTestMultiProcessHandler::TestMap::iterator i = this->Tests.begin();
  for(; i != this->Tests.end(); ++i)
    {
    if(i->first > max)
      {
      max = i->first;
      }
    }
  return max;
}